

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_ManComputeBackwardCut(Of_Man_t *p,int *pCut)

{
  int iVar1;
  bool bVar2;
  undefined4 local_24;
  undefined4 local_20;
  int Cost;
  int iVar;
  int k;
  int *pCut_local;
  Of_Man_t *p_local;
  
  local_24 = 0;
  Cost = 0;
  while( true ) {
    iVar1 = Of_CutSize(pCut);
    bVar2 = false;
    if (Cost < iVar1) {
      local_20 = Of_CutVar(pCut,Cost);
      bVar2 = local_20 != 0;
    }
    if (!bVar2) break;
    iVar1 = Of_ObjRefNum(p,local_20);
    if (iVar1 == 0) {
      iVar1 = Of_ObjFlow(p,local_20);
      local_24 = iVar1 + local_24;
    }
    Cost = Cost + 1;
  }
  return local_24;
}

Assistant:

static inline int Of_ManComputeBackwardCut( Of_Man_t * p, int * pCut )
{
    int k, iVar, Cost = 0;
    Of_CutForEachVar( pCut, iVar, k )
        if ( !Of_ObjRefNum(p, iVar) )
            Cost += Of_ObjFlow( p, iVar );
    return Cost;
}